

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.c
# Opt level: O3

void DrawRectangleRounded(Rectangle rec,float roundness,int segments,Color color)

{
  float x;
  float y;
  uchar y_00;
  uchar z;
  uchar w;
  uchar x_00;
  int iVar1;
  ulong uVar2;
  int iVar3;
  long lVar4;
  float x_01;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float y_01;
  float fVar10;
  float fVar11;
  float x_02;
  float fVar12;
  float local_10c;
  undefined8 local_68;
  float local_60;
  float local_5c;
  undefined8 local_58;
  float local_50;
  float local_4c;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  
  uVar2 = (ulong)(uint)segments;
  fVar8 = rec.width;
  fVar9 = rec.height;
  x_01 = rec.x;
  fVar12 = rec.y;
  w = color.a;
  if (((0.0 < roundness) && (1.0 <= fVar8)) && (1.0 <= fVar9)) {
    fVar11 = 1.0;
    if (roundness <= 1.0) {
      fVar11 = roundness;
    }
    fVar5 = fVar9;
    if (fVar8 <= fVar9) {
      fVar5 = fVar8;
    }
    fVar11 = fVar5 * fVar11 * 0.5;
    if (0.0 < fVar11) {
      y_00 = color.g;
      z = color.b;
      local_48 = fVar12;
      fStack_44 = fVar12;
      fStack_40 = fVar12;
      fStack_3c = fVar12;
      if (segments < 4) {
        fVar5 = -0.5 / fVar11 + 1.0;
        fVar5 = fVar5 * fVar5;
        fVar5 = acosf(fVar5 + fVar5 + -1.0);
        fVar5 = ceilf(6.2831855 / fVar5);
        uVar2 = 4;
        if (0 < (int)(fVar5 * 0.25)) {
          uVar2 = (ulong)(uint)(int)(fVar5 * 0.25);
        }
      }
      iVar1 = (int)uVar2;
      fVar10 = 90.0 / (float)iVar1;
      fVar8 = fVar8 + x_01;
      fVar9 = fVar9 + fVar12;
      x_02 = x_01 + fVar11;
      fVar12 = fVar12 + fVar11;
      local_68 = CONCAT44(fVar12,x_02);
      fVar5 = fVar8 - fVar11;
      y_01 = fVar9 - fVar11;
      local_58 = CONCAT44(y_01,fVar5);
      local_60 = fVar5;
      local_5c = fVar12;
      local_50 = x_02;
      local_4c = y_01;
      rlCheckRenderBatchLimit(iVar1 * 8 + 0x14);
      rlSetTexture(texShapes.id);
      rlBegin(7);
      lVar4 = 0;
      do {
        local_10c = (float)(&DAT_00163240)[lVar4];
        x = *(float *)(&local_68 + lVar4);
        y = *(float *)((long)&local_68 + lVar4 * 8 + 4);
        x_00 = color.r;
        iVar3 = (int)(uVar2 >> 0x1f) + iVar1 >> 1;
        if (1 < iVar1) {
          do {
            rlColor4ub(x_00,y_00,z,w);
            rlTexCoord2f(texShapesRec.x / (float)texShapes.width,
                         texShapesRec.y / (float)texShapes.height);
            rlVertex2f(x,y);
            rlTexCoord2f(texShapesRec.x / (float)texShapes.width,
                         (texShapesRec.y + texShapesRec.height) / (float)texShapes.height);
            fVar6 = sinf(local_10c * 0.017453292);
            fVar7 = cosf(local_10c * 0.017453292);
            rlVertex2f(fVar6 * fVar11 + x,fVar7 * fVar11 + y);
            rlTexCoord2f((texShapesRec.x + texShapesRec.width) / (float)texShapes.width,
                         (texShapesRec.y + texShapesRec.height) / (float)texShapes.height);
            fVar6 = (fVar10 + local_10c) * 0.017453292;
            fVar7 = sinf(fVar6);
            fVar6 = cosf(fVar6);
            rlVertex2f(fVar7 * fVar11 + x,fVar6 * fVar11 + y);
            rlTexCoord2f((texShapesRec.x + texShapesRec.width) / (float)texShapes.width,
                         texShapesRec.y / (float)texShapes.height);
            local_10c = local_10c + fVar10 + fVar10;
            fVar6 = sinf(local_10c * 0.017453292);
            fVar7 = cosf(local_10c * 0.017453292);
            rlVertex2f(fVar6 * fVar11 + x,fVar7 * fVar11 + y);
            iVar3 = iVar3 + -1;
          } while (iVar3 != 0);
        }
        if ((uVar2 & 1) != 0) {
          rlColor4ub(x_00,y_00,z,w);
          rlTexCoord2f(texShapesRec.x / (float)texShapes.width,
                       texShapesRec.y / (float)texShapes.height);
          rlVertex2f(x,y);
          rlTexCoord2f(texShapesRec.x / (float)texShapes.width,
                       (texShapesRec.y + texShapesRec.height) / (float)texShapes.height);
          fVar6 = sinf(local_10c * 0.017453292);
          fVar7 = cosf(local_10c * 0.017453292);
          rlVertex2f(fVar6 * fVar11 + x,fVar7 * fVar11 + y);
          rlTexCoord2f((texShapesRec.x + texShapesRec.width) / (float)texShapes.width,
                       (texShapesRec.y + texShapesRec.height) / (float)texShapes.height);
          fVar6 = (local_10c + fVar10) * 0.017453292;
          fVar7 = sinf(fVar6);
          fVar6 = cosf(fVar6);
          rlVertex2f(fVar7 * fVar11 + x,fVar6 * fVar11 + y);
          rlTexCoord2f((texShapesRec.x + texShapesRec.width) / (float)texShapes.width,
                       texShapesRec.y / (float)texShapes.height);
          rlVertex2f(x,y);
        }
        lVar4 = lVar4 + 1;
      } while (lVar4 != 4);
      rlColor4ub(x_00,y_00,z,w);
      rlTexCoord2f(texShapesRec.x / (float)texShapes.width,texShapesRec.y / (float)texShapes.height)
      ;
      rlVertex2f(x_02,local_48);
      rlTexCoord2f(texShapesRec.x / (float)texShapes.width,
                   (texShapesRec.y + texShapesRec.height) / (float)texShapes.height);
      rlVertex2f(x_02,fVar12);
      rlTexCoord2f((texShapesRec.x + texShapesRec.width) / (float)texShapes.width,
                   (texShapesRec.y + texShapesRec.height) / (float)texShapes.height);
      rlVertex2f(fVar5,fVar12);
      rlTexCoord2f((texShapesRec.x + texShapesRec.width) / (float)texShapes.width,
                   texShapesRec.y / (float)texShapes.height);
      rlVertex2f(fVar5,local_48);
      rlColor4ub(x_00,y_00,z,w);
      rlTexCoord2f(texShapesRec.x / (float)texShapes.width,texShapesRec.y / (float)texShapes.height)
      ;
      rlVertex2f(fVar8,fVar12);
      rlTexCoord2f(texShapesRec.x / (float)texShapes.width,
                   (texShapesRec.y + texShapesRec.height) / (float)texShapes.height);
      rlVertex2f(fVar5,fVar12);
      rlTexCoord2f((texShapesRec.x + texShapesRec.width) / (float)texShapes.width,
                   (texShapesRec.y + texShapesRec.height) / (float)texShapes.height);
      rlVertex2f(fVar5,y_01);
      rlTexCoord2f((texShapesRec.x + texShapesRec.width) / (float)texShapes.width,
                   texShapesRec.y / (float)texShapes.height);
      rlVertex2f(fVar8,y_01);
      rlColor4ub(x_00,y_00,z,w);
      rlTexCoord2f(texShapesRec.x / (float)texShapes.width,texShapesRec.y / (float)texShapes.height)
      ;
      rlVertex2f(x_02,y_01);
      rlTexCoord2f(texShapesRec.x / (float)texShapes.width,
                   (texShapesRec.y + texShapesRec.height) / (float)texShapes.height);
      rlVertex2f(x_02,fVar9);
      rlTexCoord2f((texShapesRec.x + texShapesRec.width) / (float)texShapes.width,
                   (texShapesRec.y + texShapesRec.height) / (float)texShapes.height);
      rlVertex2f(fVar5,fVar9);
      rlTexCoord2f((texShapesRec.x + texShapesRec.width) / (float)texShapes.width,
                   texShapesRec.y / (float)texShapes.height);
      rlVertex2f(fVar5,y_01);
      rlColor4ub(x_00,y_00,z,w);
      rlTexCoord2f(texShapesRec.x / (float)texShapes.width,texShapesRec.y / (float)texShapes.height)
      ;
      rlVertex2f(x_01,fVar12);
      rlTexCoord2f(texShapesRec.x / (float)texShapes.width,
                   (texShapesRec.y + texShapesRec.height) / (float)texShapes.height);
      rlVertex2f(x_01,y_01);
      rlTexCoord2f((texShapesRec.x + texShapesRec.width) / (float)texShapes.width,
                   (texShapesRec.y + texShapesRec.height) / (float)texShapes.height);
      rlVertex2f(x_02,y_01);
      rlTexCoord2f((texShapesRec.x + texShapesRec.width) / (float)texShapes.width,
                   texShapesRec.y / (float)texShapes.height);
      rlVertex2f(x_02,fVar12);
      rlColor4ub(x_00,y_00,z,w);
      rlTexCoord2f(texShapesRec.x / (float)texShapes.width,texShapesRec.y / (float)texShapes.height)
      ;
      rlVertex2f(x_02,fVar12);
      rlTexCoord2f(texShapesRec.x / (float)texShapes.width,
                   (texShapesRec.y + texShapesRec.height) / (float)texShapes.height);
      rlVertex2f(x_02,y_01);
      rlTexCoord2f((texShapesRec.x + texShapesRec.width) / (float)texShapes.width,
                   (texShapesRec.y + texShapesRec.height) / (float)texShapes.height);
      rlVertex2f(fVar5,y_01);
      rlTexCoord2f((texShapesRec.x + texShapesRec.width) / (float)texShapes.width,
                   texShapesRec.y / (float)texShapes.height);
      rlVertex2f(fVar5,fVar12);
      rlEnd();
      rlSetTexture(0);
    }
    return;
  }
  DrawRectanglePro(rec,(Vector2)0x0,0.0,color);
  return;
}

Assistant:

void DrawRectangleRounded(Rectangle rec, float roundness, int segments, Color color)
{
    // Not a rounded rectangle
    if ((roundness <= 0.0f) || (rec.width < 1) || (rec.height < 1 ))
    {
        DrawRectangleRec(rec, color);
        return;
    }

    if (roundness >= 1.0f) roundness = 1.0f;

    // Calculate corner radius
    float radius = (rec.width > rec.height)? (rec.height*roundness)/2 : (rec.width*roundness)/2;
    if (radius <= 0.0f) return;

    // Calculate number of segments to use for the corners
    if (segments < 4)
    {
        // Calculate the maximum angle between segments based on the error rate (usually 0.5f)
        float th = acosf(2*powf(1 - SMOOTH_CIRCLE_ERROR_RATE/radius, 2) - 1);
        segments = (int)(ceilf(2*PI/th)/4.0f);
        if (segments <= 0) segments = 4;
    }

    float stepLength = 90.0f/(float)segments;

    /*
    Quick sketch to make sense of all of this,
    there are 9 parts to draw, also mark the 12 points we'll use

          P0____________________P1
          /|                    |\
         /1|          2         |3\
     P7 /__|____________________|__\ P2
       |   |P8                P9|   |
       | 8 |          9         | 4 |
       | __|____________________|__ |
     P6 \  |P11              P10|  / P3
         \7|          6         |5/
          \|____________________|/
          P5                    P4
    */
    // Coordinates of the 12 points that define the rounded rect
    const Vector2 point[12] = {
        {(float)rec.x + radius, rec.y}, {(float)(rec.x + rec.width) - radius, rec.y}, { rec.x + rec.width, (float)rec.y + radius },     // PO, P1, P2
        {rec.x + rec.width, (float)(rec.y + rec.height) - radius}, {(float)(rec.x + rec.width) - radius, rec.y + rec.height},           // P3, P4
        {(float)rec.x + radius, rec.y + rec.height}, { rec.x, (float)(rec.y + rec.height) - radius}, {rec.x, (float)rec.y + radius},    // P5, P6, P7
        {(float)rec.x + radius, (float)rec.y + radius}, {(float)(rec.x + rec.width) - radius, (float)rec.y + radius},                   // P8, P9
        {(float)(rec.x + rec.width) - radius, (float)(rec.y + rec.height) - radius}, {(float)rec.x + radius, (float)(rec.y + rec.height) - radius} // P10, P11
    };

    const Vector2 centers[4] = { point[8], point[9], point[10], point[11] };
    const float angles[4] = { 180.0f, 90.0f, 0.0f, 270.0f };

#if defined(SUPPORT_QUADS_DRAW_MODE)
    rlCheckRenderBatchLimit(16*segments/2 + 5*4);

    rlSetTexture(texShapes.id);

    rlBegin(RL_QUADS);
        // Draw all of the 4 corners: [1] Upper Left Corner, [3] Upper Right Corner, [5] Lower Right Corner, [7] Lower Left Corner
        for (int k = 0; k < 4; ++k) // Hope the compiler is smart enough to unroll this loop
        {
            float angle = angles[k];
            const Vector2 center = centers[k];

            // NOTE: Every QUAD actually represents two segments
            for (int i = 0; i < segments/2; i++)
            {
                rlColor4ub(color.r, color.g, color.b, color.a);
                rlTexCoord2f(texShapesRec.x/texShapes.width, texShapesRec.y/texShapes.height);
                rlVertex2f(center.x, center.y);
                rlTexCoord2f(texShapesRec.x/texShapes.width, (texShapesRec.y + texShapesRec.height)/texShapes.height);
                rlVertex2f(center.x + sinf(DEG2RAD*angle)*radius, center.y + cosf(DEG2RAD*angle)*radius);
                rlTexCoord2f((texShapesRec.x + texShapesRec.width)/texShapes.width, (texShapesRec.y + texShapesRec.height)/texShapes.height);
                rlVertex2f(center.x + sinf(DEG2RAD*(angle + stepLength))*radius, center.y + cosf(DEG2RAD*(angle + stepLength))*radius);
                rlTexCoord2f((texShapesRec.x + texShapesRec.width)/texShapes.width, texShapesRec.y/texShapes.height);
                rlVertex2f(center.x + sinf(DEG2RAD*(angle + stepLength*2))*radius, center.y + cosf(DEG2RAD*(angle + stepLength*2))*radius);
                angle += (stepLength*2);
            }

            // NOTE: In case number of segments is odd, we add one last piece to the cake
            if (segments%2)
            {
                rlColor4ub(color.r, color.g, color.b, color.a);
                rlTexCoord2f(texShapesRec.x/texShapes.width, texShapesRec.y/texShapes.height);
                rlVertex2f(center.x, center.y);
                rlTexCoord2f(texShapesRec.x/texShapes.width, (texShapesRec.y + texShapesRec.height)/texShapes.height);
                rlVertex2f(center.x + sinf(DEG2RAD*angle)*radius, center.y + cosf(DEG2RAD*angle)*radius);
                rlTexCoord2f((texShapesRec.x + texShapesRec.width)/texShapes.width, (texShapesRec.y + texShapesRec.height)/texShapes.height);
                rlVertex2f(center.x + sinf(DEG2RAD*(angle + stepLength))*radius, center.y + cosf(DEG2RAD*(angle + stepLength))*radius);
                rlTexCoord2f((texShapesRec.x + texShapesRec.width)/texShapes.width, texShapesRec.y/texShapes.height);
                rlVertex2f(center.x, center.y);
            }
        }

        // [2] Upper Rectangle
        rlColor4ub(color.r, color.g, color.b, color.a);
        rlTexCoord2f(texShapesRec.x/texShapes.width, texShapesRec.y/texShapes.height);
        rlVertex2f(point[0].x, point[0].y);
        rlTexCoord2f(texShapesRec.x/texShapes.width, (texShapesRec.y + texShapesRec.height)/texShapes.height);
        rlVertex2f(point[8].x, point[8].y);
        rlTexCoord2f((texShapesRec.x + texShapesRec.width)/texShapes.width, (texShapesRec.y + texShapesRec.height)/texShapes.height);
        rlVertex2f(point[9].x, point[9].y);
        rlTexCoord2f((texShapesRec.x + texShapesRec.width)/texShapes.width, texShapesRec.y/texShapes.height);
        rlVertex2f(point[1].x, point[1].y);

        // [4] Right Rectangle
        rlColor4ub(color.r, color.g, color.b, color.a);
        rlTexCoord2f(texShapesRec.x/texShapes.width, texShapesRec.y/texShapes.height);
        rlVertex2f(point[2].x, point[2].y);
        rlTexCoord2f(texShapesRec.x/texShapes.width, (texShapesRec.y + texShapesRec.height)/texShapes.height);
        rlVertex2f(point[9].x, point[9].y);
        rlTexCoord2f((texShapesRec.x + texShapesRec.width)/texShapes.width, (texShapesRec.y + texShapesRec.height)/texShapes.height);
        rlVertex2f(point[10].x, point[10].y);
        rlTexCoord2f((texShapesRec.x + texShapesRec.width)/texShapes.width, texShapesRec.y/texShapes.height);
        rlVertex2f(point[3].x, point[3].y);

        // [6] Bottom Rectangle
        rlColor4ub(color.r, color.g, color.b, color.a);
        rlTexCoord2f(texShapesRec.x/texShapes.width, texShapesRec.y/texShapes.height);
        rlVertex2f(point[11].x, point[11].y);
        rlTexCoord2f(texShapesRec.x/texShapes.width, (texShapesRec.y + texShapesRec.height)/texShapes.height);
        rlVertex2f(point[5].x, point[5].y);
        rlTexCoord2f((texShapesRec.x + texShapesRec.width)/texShapes.width, (texShapesRec.y + texShapesRec.height)/texShapes.height);
        rlVertex2f(point[4].x, point[4].y);
        rlTexCoord2f((texShapesRec.x + texShapesRec.width)/texShapes.width, texShapesRec.y/texShapes.height);
        rlVertex2f(point[10].x, point[10].y);

        // [8] Left Rectangle
        rlColor4ub(color.r, color.g, color.b, color.a);
        rlTexCoord2f(texShapesRec.x/texShapes.width, texShapesRec.y/texShapes.height);
        rlVertex2f(point[7].x, point[7].y);
        rlTexCoord2f(texShapesRec.x/texShapes.width, (texShapesRec.y + texShapesRec.height)/texShapes.height);
        rlVertex2f(point[6].x, point[6].y);
        rlTexCoord2f((texShapesRec.x + texShapesRec.width)/texShapes.width, (texShapesRec.y + texShapesRec.height)/texShapes.height);
        rlVertex2f(point[11].x, point[11].y);
        rlTexCoord2f((texShapesRec.x + texShapesRec.width)/texShapes.width, texShapesRec.y/texShapes.height);
        rlVertex2f(point[8].x, point[8].y);

        // [9] Middle Rectangle
        rlColor4ub(color.r, color.g, color.b, color.a);
        rlTexCoord2f(texShapesRec.x/texShapes.width, texShapesRec.y/texShapes.height);
        rlVertex2f(point[8].x, point[8].y);
        rlTexCoord2f(texShapesRec.x/texShapes.width, (texShapesRec.y + texShapesRec.height)/texShapes.height);
        rlVertex2f(point[11].x, point[11].y);
        rlTexCoord2f((texShapesRec.x + texShapesRec.width)/texShapes.width, (texShapesRec.y + texShapesRec.height)/texShapes.height);
        rlVertex2f(point[10].x, point[10].y);
        rlTexCoord2f((texShapesRec.x + texShapesRec.width)/texShapes.width, texShapesRec.y/texShapes.height);
        rlVertex2f(point[9].x, point[9].y);

    rlEnd();
    rlSetTexture(0);
#else
    rlCheckRenderBatchLimit(12*segments + 5*6); // 4 corners with 3 vertices per segment + 5 rectangles with 6 vertices each

    rlBegin(RL_TRIANGLES);

        // Draw all of the 4 corners: [1] Upper Left Corner, [3] Upper Right Corner, [5] Lower Right Corner, [7] Lower Left Corner
        for (int k = 0; k < 4; ++k) // Hope the compiler is smart enough to unroll this loop
        {
            float angle = angles[k];
            const Vector2 center = centers[k];
            for (int i = 0; i < segments; i++)
            {
                rlColor4ub(color.r, color.g, color.b, color.a);
                rlVertex2f(center.x, center.y);
                rlVertex2f(center.x + sinf(DEG2RAD*angle)*radius, center.y + cosf(DEG2RAD*angle)*radius);
                rlVertex2f(center.x + sinf(DEG2RAD*(angle + stepLength))*radius, center.y + cosf(DEG2RAD*(angle + stepLength))*radius);
                angle += stepLength;
            }
        }

        // [2] Upper Rectangle
        rlColor4ub(color.r, color.g, color.b, color.a);
        rlVertex2f(point[0].x, point[0].y);
        rlVertex2f(point[8].x, point[8].y);
        rlVertex2f(point[9].x, point[9].y);
        rlVertex2f(point[1].x, point[1].y);
        rlVertex2f(point[0].x, point[0].y);
        rlVertex2f(point[9].x, point[9].y);

        // [4] Right Rectangle
        rlColor4ub(color.r, color.g, color.b, color.a);
        rlVertex2f(point[9].x, point[9].y);
        rlVertex2f(point[10].x, point[10].y);
        rlVertex2f(point[3].x, point[3].y);
        rlVertex2f(point[2].x, point[2].y);
        rlVertex2f(point[9].x, point[9].y);
        rlVertex2f(point[3].x, point[3].y);

        // [6] Bottom Rectangle
        rlColor4ub(color.r, color.g, color.b, color.a);
        rlVertex2f(point[11].x, point[11].y);
        rlVertex2f(point[5].x, point[5].y);
        rlVertex2f(point[4].x, point[4].y);
        rlVertex2f(point[10].x, point[10].y);
        rlVertex2f(point[11].x, point[11].y);
        rlVertex2f(point[4].x, point[4].y);

        // [8] Left Rectangle
        rlColor4ub(color.r, color.g, color.b, color.a);
        rlVertex2f(point[7].x, point[7].y);
        rlVertex2f(point[6].x, point[6].y);
        rlVertex2f(point[11].x, point[11].y);
        rlVertex2f(point[8].x, point[8].y);
        rlVertex2f(point[7].x, point[7].y);
        rlVertex2f(point[11].x, point[11].y);

        // [9] Middle Rectangle
        rlColor4ub(color.r, color.g, color.b, color.a);
        rlVertex2f(point[8].x, point[8].y);
        rlVertex2f(point[11].x, point[11].y);
        rlVertex2f(point[10].x, point[10].y);
        rlVertex2f(point[9].x, point[9].y);
        rlVertex2f(point[8].x, point[8].y);
        rlVertex2f(point[10].x, point[10].y);
    rlEnd();
#endif
}